

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O0

ScalarFunction * duckdb::MapKeysFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  ScalarFunction *function;
  LogicalType *function_00;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  LogicalType local_150 [24];
  BaseScalarFunction local_138 [176];
  LogicalType local_88 [24];
  undefined1 local_70 [48];
  LogicalType local_40 [24];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined1 local_9;
  
  local_9 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xd98558);
  duckdb::LogicalType::LogicalType(local_40,LIST);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe78
            );
  duckdb::LogicalType::LogicalType(local_88,INVALID);
  this = (LogicalType *)0x0;
  function_00 = (LogicalType *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,&local_28,local_40,local_70,MapKeysBind,0,0,0,local_88,0,0,0);
  duckdb::LogicalType::~LogicalType(local_88);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd9860f);
  duckdb::LogicalType::~LogicalType(local_40);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd98629);
  in_RDI->field_0xa9 = 1;
  BaseScalarFunction::SetReturnsError((BaseScalarFunction *)function_00);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_138);
  duckdb::LogicalType::LogicalType(local_150,ANY);
  LogicalType::operator=(this,function_00);
  duckdb::LogicalType::~LogicalType(local_150);
  return in_RDI;
}

Assistant:

ScalarFunction MapKeysFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction function({}, LogicalTypeId::LIST, MapKeysFunction, MapKeysBind);
	function.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(function);
	function.varargs = LogicalType::ANY;
	return function;
}